

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

Var Js::JavascriptOperators::ToUnscopablesWrapperObject(Var aRight,ScriptContext *scriptContext)

{
  bool bVar1;
  ThreadContext *pTVar2;
  RecyclableObject *wrappedObject;
  Recycler *alloc;
  UnscopablesWrapperObject *this;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  pTVar2 = scriptContext->threadContext;
  bVar1 = pTVar2->noJsReentrancy;
  pTVar2->noJsReentrancy = true;
  wrappedObject = VarTo<Js::RecyclableObject>(aRight);
  local_58 = (undefined1  [8])&UnscopablesWrapperObject::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_4e91f59;
  data.filename._0_4_ = 0x2ac0;
  alloc = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_58);
  this = (UnscopablesWrapperObject *)new<Memory::Recycler>(0x18,alloc,0x387914);
  UnscopablesWrapperObject::UnscopablesWrapperObject
            (this,wrappedObject,
             (((scriptContext->super_ScriptContextBase).javascriptLibrary)->withType).ptr);
  pTVar2->noJsReentrancy = bVar1;
  return this;
}

Assistant:

Var JavascriptOperators::ToUnscopablesWrapperObject(Var aRight, ScriptContext* scriptContext)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(Op_NewUnscopablesWrapperObject, reentrancylock, scriptContext->GetThreadContext());
        RecyclableObject* object = VarTo<RecyclableObject>(aRight);

        UnscopablesWrapperObject* withWrapper = RecyclerNew(scriptContext->GetRecycler(), UnscopablesWrapperObject, object, scriptContext->GetLibrary()->GetWithType());
        return withWrapper;
        JIT_HELPER_END(Op_NewUnscopablesWrapperObject);
    }